

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O3

void pubkeyExceptionTest(string *hex)

{
  ByteData BVar1;
  pointer puVar2;
  bool bVar3;
  undefined1 in_stack_ffffffffffffff88 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  pointer puStack_60;
  pointer local_58;
  Pubkey local_48;
  ByteData local_28;
  
  cfd::core::Pubkey::Pubkey(&local_48);
  bVar3 = testing::internal::AlwaysTrue();
  sVar4.ptr_ = in_stack_ffffffffffffff98.ptr_;
  sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_48.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (bVar3) {
    cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffff98,(string *)hex);
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_60;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_58;
    sVar4.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    puStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    sVar5.ptr_ = in_stack_ffffffffffffff98.ptr_;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = in_stack_ffffffffffffff98.ptr_;
      operator_delete(local_48.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)sVar5.ptr_;
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_48.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if (sVar4.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sVar4.ptr_);
        sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_48.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      }
    }
  }
  local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)sVar5.ptr_;
  testing::Message::Message((Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffff90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_pubkey.cpp"
             ,99,
             "Expected: (pubkey = Pubkey(hex)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffff90,(Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff90);
  if (sVar4.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (sVar4.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       )) {
      (**(code **)(*(long *)sVar4.ptr_ + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::core::ByteData::ByteData(&local_28,(string *)hex);
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)sVar4.ptr_;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff88._0_8_;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff88._8_8_;
    cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffff98,BVar1);
    puVar2 = local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_60;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_58;
    sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar3 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)sVar4.ptr_;
    if (bVar3) {
      operator_delete(puVar2);
      if (sVar5.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sVar5.ptr_);
      }
    }
    sVar4.ptr_ = sVar5.ptr_;
    if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffff90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_pubkey.cpp"
             ,100,
             "Expected: (pubkey = Pubkey(ByteData(hex))) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffff90,(Message *)&stack0xffffffffffffff98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff90);
  if (sVar4.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (sVar4.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       )) {
      (**(code **)(*(long *)sVar4.ptr_ + 8))();
    }
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_48.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void pubkeyExceptionTest(std::string hex) {
  Pubkey pubkey;
  EXPECT_THROW((pubkey = Pubkey(hex)), CfdException);
  EXPECT_THROW((pubkey = Pubkey(ByteData(hex))), CfdException);
}